

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula_advanced.h
# Opt level: O0

void __thiscall Am_Formula_Advanced::~Am_Formula_Advanced(Am_Formula_Advanced *this)

{
  Am_Formula_Advanced *this_local;
  
  Am_Constraint::~Am_Constraint(&this->super_Am_Constraint);
  return;
}

Assistant:

class _OA_DL_CLASSIMPORT Am_Formula_Advanced : public Am_Constraint
{
public:
  static bool Test(Am_Constraint *formula);
  static Am_Formula_Advanced *Narrow(Am_Constraint *formula);

  virtual Am_Formula_Mode Get_Mode() = 0;
  virtual void Set_Mode(Am_Formula_Mode mode) = 0;

  virtual Am_Slot Get_Context() = 0;
}